

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demand_queue.hpp
# Opt level: O0

demand_unique_ptr_t __thiscall
so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t::pop(demand_queue_t *this)

{
  type lock_00;
  shutdown_ex_t *this_00;
  pointer pdVar1;
  demand_queue_t *in_RSI;
  bool bVar2;
  unique_lock_t local_20;
  unique_lock_t lock;
  demand_queue_t *this_local;
  demand_unique_ptr_t *result;
  
  lock_00 = std::
            unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
            ::operator*(&in_RSI->m_lock);
  mpsc_queue_traits::unique_lock_t::unique_lock_t(&local_20,lock_00);
  while( true ) {
    bVar2 = false;
    if ((in_RSI->m_shutdown & 1U) == 0) {
      bVar2 = in_RSI->m_total_demands_count == 0;
    }
    if (!bVar2) break;
    mpsc_queue_traits::unique_lock_t::wait_for_notify(&local_20);
  }
  if ((in_RSI->m_shutdown & 1U) != 0) {
    this_00 = (shutdown_ex_t *)__cxa_allocate_exception(8);
    *this_00 = (shutdown_ex_t)0x0;
    shutdown_ex_t::shutdown_ex_t(this_00);
    __cxa_throw(this_00,&shutdown_ex_t::typeinfo,shutdown_ex_t::~shutdown_ex_t);
  }
  while (in_RSI->m_current_priority->m_head == (demand_t *)0x0) {
    switch_to_lower_priority(in_RSI);
  }
  std::
  unique_ptr<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t,std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>>
  ::
  unique_ptr<std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>,void>
            ((unique_ptr<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t,std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>>
              *)this,in_RSI->m_current_priority->m_head);
  pdVar1 = std::
           unique_ptr<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>_>
           ::operator->((unique_ptr<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>_>
                         *)this);
  in_RSI->m_current_priority->m_head = pdVar1->m_next;
  if (in_RSI->m_current_priority->m_head == (demand_t *)0x0) {
    in_RSI->m_current_priority->m_tail = (demand_t *)0x0;
  }
  pdVar1 = std::
           unique_ptr<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>_>
           ::operator->((unique_ptr<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>_>
                         *)this);
  pdVar1->m_next = (demand_t *)0x0;
  std::__atomic_base<unsigned_long>::operator--
            (&(in_RSI->m_current_priority->m_demands_count).super___atomic_base<unsigned_long>);
  in_RSI->m_total_demands_count = in_RSI->m_total_demands_count - 1;
  in_RSI->m_current_priority->m_demands_processed =
       in_RSI->m_current_priority->m_demands_processed + 1;
  if (in_RSI->m_current_priority->m_quote <= in_RSI->m_current_priority->m_demands_processed) {
    switch_to_lower_priority(in_RSI);
  }
  mpsc_queue_traits::unique_lock_t::~unique_lock_t(&local_20);
  return (__uniq_ptr_data<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>,_true,_true>
          )(__uniq_ptr_data<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_t>,_true,_true>
            )this;
}

Assistant:

demand_unique_ptr_t
		pop()
			{
				queue_traits::unique_lock_t lock{ *m_lock };

				while( !m_shutdown && !m_total_demands_count )
					lock.wait_for_notify();

				if( m_shutdown )
					throw shutdown_ex_t();

				// Note: this loop should not be infinitife because
				// m_total_demands_count is not a zero. It means that
				// there is at least one demand somewhere.
				while( !m_current_priority->m_head )
					switch_to_lower_priority();

				// There is a demand to extract.
				demand_unique_ptr_t result{ m_current_priority->m_head };

				m_current_priority->m_head = result->m_next;
				if( !m_current_priority->m_head )
					m_current_priority->m_tail = nullptr;

				result->m_next = nullptr;

				--(m_current_priority->m_demands_count);
				--m_total_demands_count;

				++(m_current_priority->m_demands_processed);

				if( m_current_priority->m_demands_processed >=
						m_current_priority->m_quote )
					{
						// Processing of this priority on the current
						// iteration is finished.
						switch_to_lower_priority();
					}

				return result;
			}